

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cpp
# Opt level: O0

ptr<Integer> __thiscall Array::length(Array *this)

{
  element_type *this_00;
  long in_RSI;
  ptr<Integer> pVar1;
  Array *this_local;
  
  this_00 = std::
            __shared_ptr_access<std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(in_RSI + 0x10));
  std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::size(this_00);
  pVar1 = make<Integer,unsigned_long>((unsigned_long *)this);
  pVar1.super___shared_ptr<Integer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Integer>)pVar1.super___shared_ptr<Integer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Integer> Array::length() {
    return make<Integer>(values->size());
}